

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

TArray<SBarInfoCommand_*,_SBarInfoCommand_*> * __thiscall
TArray<SBarInfoCommand_*,_SBarInfoCommand_*>::operator=
          (TArray<SBarInfoCommand_*,_SBarInfoCommand_*> *this,
          TArray<SBarInfoCommand_*,_SBarInfoCommand_*> *other)

{
  uint uVar1;
  SBarInfoCommand **block;
  
  block = this->Array;
  if (block != (SBarInfoCommand **)0x0) {
    if (this->Count != 0) {
      DoDelete(this,0,this->Count - 1);
      block = this->Array;
    }
    M_Free(block);
  }
  this->Array = other->Array;
  other->Array = (SBarInfoCommand **)0x0;
  uVar1 = other->Count;
  this->Most = other->Most;
  this->Count = uVar1;
  other->Most = 0;
  other->Count = 0;
  return this;
}

Assistant:

TArray<T,TT> &operator= (TArray<T,TT> &&other)
	{
		if (Array)
		{
			if (Count > 0)
			{
				DoDelete (0, Count-1);
			}
			M_Free (Array);
		}
		Array = other.Array; other.Array = NULL;
		Most = other.Most; other.Most = 0;
		Count = other.Count; other.Count = 0;
		return *this;
	}